

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O0

void __thiscall
QGraphicsSceneBspTreeIndexPrivate::_q_updateIndex(QGraphicsSceneBspTreeIndexPrivate *this)

{
  bool bVar1;
  value_type_conflict3 vVar2;
  int iVar3;
  int iVar4;
  QRectF *rect;
  qsizetype qVar5;
  const_reference ppQVar6;
  QGraphicsItemPrivate *pQVar7;
  reference ppQVar8;
  long lVar9;
  longlong lVar10;
  QGraphicsSceneBspTree *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *item_1;
  int i_1;
  int oldDepth;
  int freeIndex;
  QGraphicsItem *item;
  int i;
  parameter_type in_stack_ffffffffffffff58;
  QGraphicsSceneBspTree *in_stack_ffffffffffffff60;
  QGraphicsSceneBspTree *this_00;
  QGraphicsSceneBspTreeIndexPrivate *in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  QGraphicsItem *in_stack_ffffffffffffff88;
  int depth;
  QGraphicsItem *pQVar11;
  int local_54;
  int local_3c;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QBasicTimer::isActive((QBasicTimer *)((long)&in_RDI[2].rect.w + 4));
  if (bVar1) {
    QBasicTimer::stop();
    purgeRemovedItems(in_stack_ffffffffffffff70);
    local_3c = 0;
    while( true ) {
      rect = (QRectF *)(long)local_3c;
      qVar5 = QList<QGraphicsItem_*>::size((QList<QGraphicsItem_*> *)&in_RDI[3].leaves);
      depth = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
      if (qVar5 <= (long)rect) break;
      ppQVar6 = QList<QGraphicsItem_*>::at
                          ((QList<QGraphicsItem_*> *)in_stack_ffffffffffffff60,
                           (qsizetype)in_stack_ffffffffffffff58);
      pQVar11 = *ppQVar6;
      if (pQVar11 != (QGraphicsItem *)0x0) {
        bVar1 = QList<int>::isEmpty((QList<int> *)0xa1dcaa);
        if (bVar1) {
          qVar5 = QList<QGraphicsItem_*>::size((QList<QGraphicsItem_*> *)(in_RDI + 3));
          pQVar7 = QGraphicsItem::d_func((QGraphicsItem *)0xa1dd28);
          pQVar7->index = (int)qVar5;
          QList<QGraphicsItem_*>::operator<<
                    ((QList<QGraphicsItem_*> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        }
        else {
          vVar2 = QList<int>::takeFirst((QList<int> *)in_stack_ffffffffffffff60);
          pQVar7 = QGraphicsItem::d_func((QGraphicsItem *)0xa1dcd5);
          pQVar7->index = vVar2;
          ppQVar8 = QList<QGraphicsItem_*>::operator[]
                              ((QList<QGraphicsItem_*> *)in_stack_ffffffffffffff60,
                               (qsizetype)in_stack_ffffffffffffff58);
          *ppQVar8 = pQVar11;
          in_stack_ffffffffffffff88 = pQVar11;
        }
      }
      local_3c = local_3c + 1;
    }
    if (*(int *)&in_RDI[2].rect.w == 0) {
      iVar3 = intmaxlog((int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
      QList<QGraphicsItem_*>::size((QList<QGraphicsItem_*> *)(in_RDI + 3));
      iVar4 = intmaxlog((int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
      *(int *)&in_RDI[2].rect.w = iVar4;
      iVar4 = QGraphicsSceneBspTree::leafCount((QGraphicsSceneBspTree *)&in_RDI[1].leaves.d.size);
      in_stack_ffffffffffffff7f = true;
      if ((iVar4 != 0) &&
         (in_stack_ffffffffffffff7e = false, in_stack_ffffffffffffff7f = in_stack_ffffffffffffff7e,
         iVar3 != *(int *)&in_RDI[2].rect.w)) {
        lVar9 = (long)*(int *)((long)&in_RDI[2].rect.h + 4);
        qVar5 = QList<QGraphicsItem_*>::size((QList<QGraphicsItem_*> *)(in_RDI + 3));
        local_10 = lVar9 - qVar5;
        lVar10 = qAbs<long_long>(&local_10);
        in_stack_ffffffffffffff7e = 100 < lVar10;
        in_stack_ffffffffffffff7f = in_stack_ffffffffffffff7e;
      }
      if ((bool)in_stack_ffffffffffffff7f != false) {
        *(undefined1 *)((long)&in_RDI[2].rect.h + 1) = 1;
      }
    }
    if (((ulong)in_RDI[2].rect.h & 0x100) != 0) {
      *(undefined1 *)((long)&in_RDI[2].rect.h + 1) = 0;
      QGraphicsSceneBspTree::initialize(in_RDI,rect,depth);
      QList<QGraphicsItem_*>::operator=
                ((QList<QGraphicsItem_*> *)in_stack_ffffffffffffff60,
                 (QList<QGraphicsItem_*> *)in_stack_ffffffffffffff58);
      qVar5 = QList<QGraphicsItem_*>::size((QList<QGraphicsItem_*> *)(in_RDI + 3));
      *(int *)((long)&in_RDI[2].rect.h + 4) = (int)qVar5;
    }
    for (local_54 = 0;
        qVar5 = QList<QGraphicsItem_*>::size((QList<QGraphicsItem_*> *)&in_RDI[3].leaves),
        local_54 < qVar5; local_54 = local_54 + 1) {
      ppQVar6 = QList<QGraphicsItem_*>::at
                          ((QList<QGraphicsItem_*> *)in_stack_ffffffffffffff60,
                           (qsizetype)in_stack_ffffffffffffff58);
      this_00 = (QGraphicsSceneBspTree *)*ppQVar6;
      if (this_00 != (QGraphicsSceneBspTree *)0x0) {
        pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                               *)&(this_00->nodes).d.ptr);
        bVar1 = QGraphicsItemPrivate::itemIsUntransformable(pQVar7);
        if (bVar1) {
          QList<QGraphicsItem_*>::operator<<
                    ((QList<QGraphicsItem_*> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        }
        else {
          pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                 *)&(this_00->nodes).d.ptr);
          if (((*(ulong *)&pQVar7->field_0x160 & 0x20000) == 0) &&
             (pQVar7 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                     *)&(this_00->nodes).d.ptr),
             (*(ulong *)&pQVar7->field_0x160 & 0x100000) == 0)) {
            in_stack_ffffffffffffff58 = (parameter_type)&in_RDI[1].leaves.d.size;
            QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
            operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                        *)&(this_00->nodes).d.ptr);
            QGraphicsItemPrivate::sceneEffectiveBoundingRect
                      ((QGraphicsItemPrivate *)
                       CONCAT17(in_stack_ffffffffffffff7f,
                                CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)));
            QGraphicsSceneBspTree::insertItem(this_00,in_stack_ffffffffffffff58,(QRectF *)0xa1dfd8);
            in_stack_ffffffffffffff60 = this_00;
          }
        }
      }
    }
    QList<QGraphicsItem_*>::clear((QList<QGraphicsItem_*> *)in_stack_ffffffffffffff60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsSceneBspTreeIndexPrivate::_q_updateIndex()
{
    if (!indexTimer.isActive())
        return;

    indexTimer.stop();

    purgeRemovedItems();

     // Add unindexedItems to indexedItems
    for (int i = 0; i < unindexedItems.size(); ++i) {
        if (QGraphicsItem *item = unindexedItems.at(i)) {
            Q_ASSERT(!item->d_ptr->itemDiscovered);
            if (!freeItemIndexes.isEmpty()) {
                int freeIndex = freeItemIndexes.takeFirst();
                item->d_func()->index = freeIndex;
                indexedItems[freeIndex] = item;
            } else {
                item->d_func()->index = indexedItems.size();
                indexedItems << item;
            }
        }
    }

    // Determine whether we should regenerate the BSP tree.
    if (bspTreeDepth == 0) {
        int oldDepth = intmaxlog(lastItemCount);
        bspTreeDepth = intmaxlog(indexedItems.size());
        static const int slack = 100;
        if (bsp.leafCount() == 0 || (oldDepth != bspTreeDepth && qAbs(lastItemCount - indexedItems.size()) > slack)) {
            // ### Crude algorithm.
            regenerateIndex = true;
        }
    }

    // Regenerate the tree.
    if (regenerateIndex) {
        regenerateIndex = false;
        bsp.initialize(sceneRect, bspTreeDepth);
        unindexedItems = indexedItems;
        lastItemCount = indexedItems.size();
    }

    // Insert all unindexed items into the tree.
    for (int i = 0; i < unindexedItems.size(); ++i) {
        if (QGraphicsItem *item = unindexedItems.at(i)) {
            if (item->d_ptr->itemIsUntransformable()) {
                untransformableItems << item;
                continue;
            }
            if (item->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren
                || item->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorContainsChildren)
                continue;

            bsp.insertItem(item, item->d_ptr->sceneEffectiveBoundingRect());
        }
    }
    unindexedItems.clear();
}